

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O0

void __thiscall
cfdcapi_script_CfdParseScript_ScriptSig_TEST_Test::TestBody
          (cfdcapi_script_CfdParseScript_ScriptSig_TEST_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  char *in_R9;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  char *str_buffer;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  string item;
  AssertionResult gtest_ar_3;
  char *pitem;
  uint32_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  script_items;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  uint32_t item_num;
  void *item_handle;
  char *unlocking_script;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffc38;
  AssertionResult *in_stack_fffffffffffffc40;
  value_type *in_stack_fffffffffffffc48;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  void **in_stack_fffffffffffffc58;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc70;
  void *in_stack_fffffffffffffc78;
  reference in_stack_fffffffffffffcb0;
  char *in_stack_fffffffffffffcb8;
  char **in_stack_fffffffffffffcd0;
  allocator *in_stack_fffffffffffffcd8;
  AssertHelper in_stack_fffffffffffffd60;
  uint32_t in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  void *in_stack_fffffffffffffd78;
  AssertHelper local_278;
  Message local_270;
  AssertionResult local_268;
  AssertHelper local_258;
  Message local_250;
  undefined4 local_244;
  AssertionResult local_240;
  char *local_230;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_214;
  AssertionResult local_210;
  AssertHelper local_200;
  Message local_1f8;
  AssertionResult local_1f0;
  AssertHelper local_1e0;
  Message local_1d8;
  AssertionResult local_1d0;
  allocator local_1b9;
  string local_1b8 [32];
  AssertHelper local_198;
  Message local_190;
  undefined4 local_184;
  AssertionResult local_180;
  char **local_170;
  uint local_164;
  pointer in_stack_fffffffffffffeb0;
  AssertHelper in_stack_fffffffffffffeb8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  AssertionResult local_130;
  string local_120;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_e9;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  uint local_ac;
  long local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffc58);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc58,
             (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             (CfdErrorCode *)in_stack_fffffffffffffc48,(int *)in_stack_fffffffffffffc40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3a48da);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3a493d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a4992);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,(type *)0x3a49c6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3a4ac2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a4b3d);
  local_a0 = 
  "47304402204b922f2dafdd926b22b0e669fd774a2d5f10f969b8089a1c3a0384ba7ce95f6e02204e71c2a620cf430fa6d7ceaeb40d5298f20eebae3ecb783714a6adc03c66717d0121038f5d4ee5a661c04de7b715c6b9ac935456419fa9f484470275d1d489f2793301"
  ;
  local_a8 = 0;
  local_ac = 0;
  local_14 = CfdParseScript((void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                            (char *)in_stack_fffffffffffffec0.ptr_,
                            (void **)in_stack_fffffffffffffeb8.data_,
                            (uint32_t *)in_stack_fffffffffffffeb0);
  local_c4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc58,
             (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             (CfdErrorCode *)in_stack_fffffffffffffc48,(int *)in_stack_fffffffffffffc40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3a4c3c);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x3a4c9f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a4cf4);
  local_e9 = local_a8 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,(type *)0x3a4d28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)&local_e8,(AssertionResult *)"(nullptr == item_handle)","true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    testing::Message::~Message((Message *)0x3a4e24);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a4e9c);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffffc58,
             (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             (int *)in_stack_fffffffffffffc48,(uint *)in_stack_fffffffffffffc40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffec0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3a4f49);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffeb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffeb8,(Message *)&stack0xfffffffffffffec0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffeb8);
    testing::Message::~Message((Message *)0x3a4fac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a5004);
  if (local_14 == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x3a5027);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(in_stack_fffffffffffffc70,
              CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
    for (local_164 = 0; local_164 < local_ac; local_164 = local_164 + 1) {
      local_170 = (char **)0x0;
      local_14 = CfdGetScriptItem(in_stack_fffffffffffffd78,
                                  (void *)CONCAT44(in_stack_fffffffffffffd74,
                                                   in_stack_fffffffffffffd70),
                                  in_stack_fffffffffffffd6c,(char **)in_stack_fffffffffffffd60.data_
                                 );
      local_184 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffffc58,
                 (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                 (CfdErrorCode *)in_stack_fffffffffffffc48,(int *)in_stack_fffffffffffffc40);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
      if (!bVar1) {
        testing::Message::Message(&local_190);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3a5165);
        testing::internal::AssertHelper::AssertHelper
                  (&local_198,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,100,pcVar2);
        testing::internal::AssertHelper::operator=(&local_198,&local_190);
        testing::internal::AssertHelper::~AssertHelper(&local_198);
        testing::Message::~Message((Message *)0x3a51c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a5220);
      in_stack_fffffffffffffcd8 = &local_1b9;
      in_stack_fffffffffffffcd0 = local_170;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b8,(char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcd8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc48);
      if (local_14 == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                    in_stack_fffffffffffffc48);
      }
      std::__cxx11::string::~string(local_1b8);
    }
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffea0);
    if (sVar3 == 2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffc40,(size_type)in_stack_fffffffffffffc38);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1d0,"script_items.at(0).c_str()",
                 "\"304402204b922f2dafdd926b22b0e669fd774a2d5f10f969b8089a1c3a0384ba7ce95f6e02204e71c2a620cf430fa6d7ceaeb40d5298f20eebae3ecb783714a6adc03c66717d01\""
                 ,pcVar2,
                 "304402204b922f2dafdd926b22b0e669fd774a2d5f10f969b8089a1c3a0384ba7ce95f6e02204e71c2a620cf430fa6d7ceaeb40d5298f20eebae3ecb783714a6adc03c66717d01"
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
      if (!bVar1) {
        testing::Message::Message(&local_1d8);
        in_stack_fffffffffffffcb8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3a53e7);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x6d,in_stack_fffffffffffffcb8);
        testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
        testing::internal::AssertHelper::~AssertHelper(&local_1e0);
        testing::Message::~Message((Message *)0x3a544a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a549f);
      in_stack_fffffffffffffcb0 =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc40,(size_type)in_stack_fffffffffffffc38);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1f0,"script_items.at(1).c_str()",
                 "\"038f5d4ee5a661c04de7b715c6b9ac935456419fa9f484470275d1d489f2793301\"",pcVar2,
                 "038f5d4ee5a661c04de7b715c6b9ac935456419fa9f484470275d1d489f2793301");
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
      if (!bVar1) {
        testing::Message::Message(&local_1f8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3a5552);
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x6e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        testing::Message::~Message((Message *)0x3a55af);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a5604);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  }
  local_14 = CfdFreeScriptItemHandle(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  local_214 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc58,
             (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             (CfdErrorCode *)in_stack_fffffffffffffc48,(int *)in_stack_fffffffffffffc40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3a56e1);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    testing::Message::~Message((Message *)0x3a573e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a5796);
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffc78);
  if (local_14 != 0) {
    local_230 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    local_244 = 0;
    pAVar4 = &local_240;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc58,
               (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (CfdErrorCode *)in_stack_fffffffffffffc48,(int *)in_stack_fffffffffffffc40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3a5881);
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x78,pcVar2);
      testing::internal::AssertHelper::operator=(&local_258,&local_250);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      testing::Message::~Message((Message *)0x3a58de);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a5933);
    testing::internal::CmpHelperSTREQ((internal *)&local_268,"\"\"","str_buffer","",local_230);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_268);
    if (!bVar1) {
      testing::Message::Message(&local_270);
      in_stack_fffffffffffffc58 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x3a59c8);
      testing::internal::AssertHelper::AssertHelper
                (&local_278,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x79,(char *)in_stack_fffffffffffffc58);
      testing::internal::AssertHelper::operator=(&local_278,&local_270);
      testing::internal::AssertHelper::~AssertHelper(&local_278);
      testing::Message::~Message((Message *)0x3a5a25);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a5a7a);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffc48);
    local_230 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffc48);
  pAVar4 = (AssertionResult *)&stack0xfffffffffffffd78;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc58,
             (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             (CfdErrorCode *)pAVar4,(int *)in_stack_fffffffffffffc40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffd68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3a5b4a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffd60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffd60,(Message *)&stack0xfffffffffffffd68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd60);
    testing::Message::~Message((Message *)0x3a5ba7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3a5bfc);
  return;
}

Assistant:

TEST(cfdcapi_script, CfdParseScript_ScriptSig_TEST) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  // <signature(304402204b922f2dafdd926b22b0e669fd774a2d5f10f969b8089a1c3a0384ba7ce95f6e02204e71c2a620cf430fa6d7ceaeb40d5298f20eebae3ecb783714a6adc03c66717d[ALL])> <pubkey(038f5d4ee5a661c04de7b715c6b9ac935456419fa9f484470275d1d489f2793301)>
  const char* unlocking_script = "47304402204b922f2dafdd926b22b0e669fd774a2d5f10f969b8089a1c3a0384ba7ce95f6e02204e71c2a620cf430fa6d7ceaeb40d5298f20eebae3ecb783714a6adc03c66717d0121038f5d4ee5a661c04de7b715c6b9ac935456419fa9f484470275d1d489f2793301";
  void* item_handle = nullptr;
  uint32_t item_num = 0;

  ret = CfdParseScript(handle, unlocking_script, &item_handle, &item_num);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((nullptr == item_handle));
  EXPECT_EQ(2, item_num);

  if (ret == kCfdSuccess) {
    std::vector<std::string> script_items;
    script_items.reserve(item_num);
    for (uint32_t i = 0; i < item_num; ++i) {
      char* pitem = nullptr;
      ret = CfdGetScriptItem(handle, item_handle, i, &pitem);
      EXPECT_EQ(kCfdSuccess, ret);
      std::string item(pitem);
      CfdFreeStringBuffer(pitem);
      if (ret == kCfdSuccess) {
        script_items.push_back(item);
      }
    }

    if (script_items.size() == 2) {
      EXPECT_STREQ(script_items.at(0).c_str(), "304402204b922f2dafdd926b22b0e669fd774a2d5f10f969b8089a1c3a0384ba7ce95f6e02204e71c2a620cf430fa6d7ceaeb40d5298f20eebae3ecb783714a6adc03c66717d01");
      EXPECT_STREQ(script_items.at(1).c_str(), "038f5d4ee5a661c04de7b715c6b9ac935456419fa9f484470275d1d489f2793301");
    }
  }
  ret = CfdFreeScriptItemHandle(handle, item_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}